

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O2

void __thiscall CExtPubKey::Decode(CExtPubKey *this,uchar *code)

{
  CPubKey *this_00;
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this->nDepth = *code;
  *(undefined4 *)this->vchFingerprint = *(undefined4 *)(code + 1);
  uVar1 = *(uint *)(code + 5);
  this->nChild = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar3 = *(undefined8 *)(code + 0x11);
  uVar4 = *(undefined8 *)(code + 0x19);
  uVar5 = *(undefined8 *)(code + 0x21);
  *(undefined8 *)(this->chaincode).super_base_blob<256U>.m_data._M_elems = *(undefined8 *)(code + 9)
  ;
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 8) = uVar3;
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10) = uVar4;
  *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
  this_00 = &this->pubkey;
  CPubKey::Set<unsigned_char_const*>(this_00,code + 0x29,code + 0x4a);
  if ((this->nDepth != '\0') || (*(int *)this->vchFingerprint == 0 && this->nChild == 0)) {
    bVar6 = CPubKey::IsFullyValid(this_00);
    if (bVar6) goto LAB_00631b9a;
  }
  this_00->vch[0] = 0xff;
LAB_00631b9a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CExtPubKey::Decode(const unsigned char code[BIP32_EXTKEY_SIZE]) {
    nDepth = code[0];
    memcpy(vchFingerprint, code+1, 4);
    nChild = ReadBE32(code+5);
    memcpy(chaincode.begin(), code+9, 32);
    pubkey.Set(code+41, code+BIP32_EXTKEY_SIZE);
    if ((nDepth == 0 && (nChild != 0 || ReadLE32(vchFingerprint) != 0)) || !pubkey.IsFullyValid()) pubkey = CPubKey();
}